

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_comm_create_group_
               (MPIABI_Fint *comm,MPIABI_Fint *group,MPIABI_Fint *tag,MPIABI_Fint *newcomm,
               MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  MPIABI_Fint *newcomm_local;
  MPIABI_Fint *tag_local;
  MPIABI_Fint *group_local;
  MPIABI_Fint *comm_local;
  
  mpi_comm_create_group_(comm,group,tag,newcomm,ierror);
  return;
}

Assistant:

void mpiabi_comm_create_group_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * group,
  const MPIABI_Fint * tag,
  MPIABI_Fint * newcomm,
  MPIABI_Fint * ierror
) {
  return mpi_comm_create_group_(
    comm,
    group,
    tag,
    newcomm,
    ierror
  );
}